

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::selectionSort<long,Minisat::LessThan_default<long>>(long param_1,int param_2)

{
  undefined8 uVar1;
  bool bVar2;
  long tmp;
  int best_i;
  int j;
  int i;
  int local_20;
  int local_1c;
  int local_18;
  LessThan_default<long> local_1;
  
  for (local_18 = 0; local_18 < param_2 + -1; local_18 = local_18 + 1) {
    local_20 = local_18;
    local_1c = local_18;
    while (local_1c = local_1c + 1, local_1c < param_2) {
      bVar2 = LessThan_default<long>::operator()
                        (&local_1,*(long *)(param_1 + (long)local_1c * 8),
                         *(long *)(param_1 + (long)local_20 * 8));
      if (bVar2) {
        local_20 = local_1c;
      }
    }
    uVar1 = *(undefined8 *)(param_1 + (long)local_18 * 8);
    *(undefined8 *)(param_1 + (long)local_18 * 8) = *(undefined8 *)(param_1 + (long)local_20 * 8);
    *(undefined8 *)(param_1 + (long)local_20 * 8) = uVar1;
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}